

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O1

unique_ptr<slang::ast::Compilation,_std::default_delete<slang::ast::Compilation>_> __thiscall
slang::driver::Driver::createCompilation(Driver *this)

{
  pointer psVar1;
  SourceLibrary *defaultLib;
  Compilation *pCVar2;
  char *pcVar3;
  Driver *in_RSI;
  size_t sVar4;
  pointer psVar5;
  string_view name;
  shared_ptr<slang::syntax::SyntaxTree> local_80;
  shared_ptr<slang::syntax::SyntaxTree> local_70;
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  local_60;
  
  if (((in_RSI->options).defaultLibName.
       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._M_engaged == true) &&
     (sVar4 = *(size_t *)
               ((long)&(in_RSI->options).defaultLibName.
                       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ._M_payload + 8), sVar4 != 0)) {
    pcVar3 = (in_RSI->options).defaultLibName.
             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._M_payload._M_value._M_dataplus._M_p;
  }
  else {
    pcVar3 = "work";
    sVar4 = 4;
  }
  name._M_str = pcVar3;
  name._M_len = sVar4;
  defaultLib = SourceLoader::getOrAddLibrary(&in_RSI->sourceLoader,name);
  defaultLib->isDefault = true;
  createOptionBag((Bag *)&local_60,in_RSI);
  pCVar2 = (Compilation *)operator_new(0xc58);
  ast::Compilation::Compilation(pCVar2,(Bag *)&local_60,defaultLib);
  (this->defaultComp).super_BumpAllocator.head = (Segment *)pCVar2;
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  ::~table_core(&local_60);
  psVar5 = (in_RSI->sourceLoader).libraryMapTrees.
           super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (in_RSI->sourceLoader).libraryMapTrees.
           super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar5 != psVar1) {
    do {
      pCVar2 = (Compilation *)(this->defaultComp).super_BumpAllocator.head;
      local_70.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (psVar5->super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
      local_70.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = (psVar5->super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (local_70.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_70.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_70.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_70.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_70.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      ast::Compilation::addSyntaxTree(pCVar2,&local_70);
      if (local_70.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_70.
                   super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      psVar5 = psVar5 + 1;
    } while (psVar5 != psVar1);
  }
  psVar5 = (in_RSI->syntaxTrees).
           super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (in_RSI->syntaxTrees).
           super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar5 != psVar1) {
    do {
      pCVar2 = (Compilation *)(this->defaultComp).super_BumpAllocator.head;
      local_80.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (psVar5->super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
      local_80.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = (psVar5->super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (local_80.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_80.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_80.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_80.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_80.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      ast::Compilation::addSyntaxTree(pCVar2,&local_80);
      if (local_80.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_80.
                   super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      psVar5 = psVar5 + 1;
    } while (psVar5 != psVar1);
  }
  return (__uniq_ptr_data<slang::ast::Compilation,_std::default_delete<slang::ast::Compilation>,_true,_true>
          )(__uniq_ptr_data<slang::ast::Compilation,_std::default_delete<slang::ast::Compilation>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Compilation> Driver::createCompilation() {
    SourceLibrary* defaultLib;
    if (options.defaultLibName && !options.defaultLibName->empty())
        defaultLib = sourceLoader.getOrAddLibrary(*options.defaultLibName);
    else
        defaultLib = sourceLoader.getOrAddLibrary("work");

    SLANG_ASSERT(defaultLib);
    defaultLib->isDefault = true;

    auto compilation = std::make_unique<Compilation>(createOptionBag(), defaultLib);
    for (auto& tree : sourceLoader.getLibraryMaps())
        compilation->addSyntaxTree(tree);
    for (auto& tree : syntaxTrees)
        compilation->addSyntaxTree(tree);

    return compilation;
}